

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void TestEnergyConservation
               (function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
                *createBSDF,char *description)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ShapeIntersection *pSVar3;
  polymorphic_allocator<std::byte> __args_1;
  BSDFSample *pBVar4;
  BSDFSample *pBVar5;
  Message *pMVar6;
  int iVar7;
  char *message;
  AssertionResult *__args_5;
  bool bVar8;
  float fVar9;
  float fVar10;
  type a;
  Float FVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var_00 [56];
  undefined1 auVar17 [56];
  undefined1 auVar13 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar14 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Vector3f VVar21;
  SampledSpectrum SVar22;
  bool reverseOrientation;
  undefined1 local_258 [16];
  undefined1 local_248 [20];
  int local_234;
  AssertionResult gtest_ar_;
  Tuple3<pbrt::Vector3,_float> local_220;
  BSDF *local_210;
  Point2f uo;
  optional<pbrt::BSDFSample> bs;
  Tuple3<pbrt::Vector3,_float> local_1d0;
  shared_ptr<pbrt::Disk> disk;
  shared_ptr<const_pbrt::Transform> tInv;
  shared_ptr<const_pbrt::Transform> t;
  char *description_local;
  RNG rng;
  Ray local_160;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar12 [64];
  undefined1 extraout_var [60];
  undefined1 auVar18 [56];
  
  local_258._8_8_ = local_258._0_8_;
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  description_local = description;
  pbrt::RotateX((Transform *)&si,-90.0);
  std::make_shared<pbrt::Transform_const,pbrt::Transform>((Transform *)&t);
  si.optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
        [0];
  si.optionalValue._8_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
         [0] + 2);
  si.optionalValue._16_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
        [1];
  si.optionalValue._24_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
         [1] + 2);
  si.optionalValue._32_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
        [2];
  si.optionalValue._40_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
         [2] + 2);
  si.optionalValue._48_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
        [3];
  si.optionalValue._56_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mInv).m
         [3] + 2);
  si.optionalValue._64_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[0];
  si.optionalValue._72_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[0]
        + 2);
  si.optionalValue._80_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[1];
  si.optionalValue._88_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[1]
        + 2);
  si.optionalValue._96_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[2];
  si.optionalValue._104_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[2]
        + 2);
  si.optionalValue._112_8_ =
       *(undefined8 *)
        ((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[3];
  si.optionalValue._120_8_ =
       *(undefined8 *)
        (((t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).m[3]
        + 2);
  std::make_shared<pbrt::Transform_const,pbrt::Transform>((Transform *)&tInv);
  __args_5 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x3ff00000000000;
  reverseOrientation = false;
  local_258._0_8_ = 0x4076800000000000;
  si.optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bs.optionalValue._0_8_ =
       tInv.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  auVar1._12_4_ = 0;
  auVar1._0_12_ = local_248._4_12_;
  local_248._0_16_ = auVar1 << 0x20;
  std::
  make_shared<pbrt::Disk,pbrt::Transform_const*,pbrt::Transform_const*,bool&,double,double,int,double>
            ((Transform **)&disk,(Transform **)&si,(bool *)&bs,(double *)&reverseOrientation,
             (double *)&local_160,(int *)__args_5,(double *)local_248);
  local_160.o.super_Tuple3<pbrt::Point3,_float>.x = 0.1;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.y = 1.0;
  local_160.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.y = -1.0;
  local_160.d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_160.time = 0.0;
  local_160.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  pbrt::Disk::Intersect
            (&si,disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_160,
             INFINITY);
  gtest_ar_.success_ = si.set;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (si.set == false) {
    testing::Message::Message((Message *)local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&bs,(internal *)&gtest_ar_,(AssertionResult *)"si.has_value()","false",
               "true",&__args_5->success_);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
               ,0x1ee,(char *)bs.optionalValue._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    std::__cxx11::string::~string((string *)&bs);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_258);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pSVar3 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    __args_1.memoryResource = pstd::pmr::new_delete_resource();
    local_210 = std::
                function<pbrt::BSDF_*(const_pbrt::SurfaceInteraction_&,_pstd::pmr::polymorphic_allocator<std::byte>)>
                ::operator()(createBSDF,&pSVar3->intr,__args_1);
    for (local_234 = 0; local_234 != 10; local_234 = local_234 + 1) {
      fVar9 = pbrt::RNG::Uniform<float>(&rng);
      uo.super_Tuple2<pbrt::Point2,_float>.y = pbrt::RNG::Uniform<float>(&rng);
      auVar17 = extraout_var_00;
      uo.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
      VVar21 = pbrt::SampleUniformHemisphere(&uo);
      local_1d0.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar17;
      local_1d0._0_8_ = vmovlps_avx(auVar12._0_16_);
      VVar21 = pbrt::BSDF::LocalToRender(local_210,(Vector3f *)&local_1d0);
      local_220.z = VVar21.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar17;
      local_220._0_8_ = vmovlps_avx(auVar13._0_16_);
      pbrt::SampledSpectrum::SampledSpectrum((SampledSpectrum *)&gtest_ar_,0.0);
      iVar7 = 0x4000;
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
        fVar9 = pbrt::RNG::Uniform<float>(&rng);
        fVar10 = pbrt::RNG::Uniform<float>(&rng);
        auVar14._0_4_ = pbrt::RNG::Uniform<float>(&rng);
        auVar14._4_60_ = extraout_var;
        auVar2._4_4_ = extraout_XMM0_Db;
        auVar2._0_4_ = fVar10;
        auVar2._8_4_ = extraout_XMM0_Dc;
        auVar2._12_4_ = extraout_XMM0_Dd;
        VVar21.super_Tuple3<pbrt::Vector3,_float>.z = local_220.z;
        VVar21.super_Tuple3<pbrt::Vector3,_float>.x = local_220.x;
        VVar21.super_Tuple3<pbrt::Vector3,_float>.y = local_220.y;
        auVar1 = vinsertps_avx(auVar2,auVar14._0_16_,0x10);
        auVar17 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        pbrt::BSDF::Sample_f(&bs,local_210,VVar21,fVar9,(Point2f)auVar1._0_8_,Radiance,All);
        if (bs.set == true) {
          pBVar4 = pstd::optional<pbrt::BSDFSample>::value(&bs);
          pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
          pSVar3 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          a = pbrt::AbsDot<float>(&pBVar5->wi,&(pSVar3->intr).super_Interaction.n);
          auVar18 = extraout_var_01;
          SVar22 = pbrt::SampledSpectrum::operator*(&pBVar4->f,a);
          auVar19._0_8_ = SVar22.values.values._8_8_;
          auVar19._8_56_ = auVar17;
          auVar15._0_8_ = SVar22.values.values._0_8_;
          auVar15._8_56_ = auVar18;
          local_248._0_16_ = vmovlhps_avx(auVar15._0_16_,auVar19._0_16_);
          pBVar4 = pstd::optional<pbrt::BSDFSample>::value(&bs);
          auVar18 = (undefined1  [56])0x0;
          SVar22 = pbrt::SampledSpectrum::operator/((SampledSpectrum *)local_248,pBVar4->pdf);
          auVar20._0_8_ = SVar22.values.values._8_8_;
          auVar20._8_56_ = auVar17;
          auVar16._0_8_ = SVar22.values.values._0_8_;
          auVar16._8_56_ = auVar18;
          local_258 = vmovlhps_avx(auVar16._0_16_,auVar20._0_16_);
          pbrt::SampledSpectrum::operator+=
                    ((SampledSpectrum *)&gtest_ar_,(SampledSpectrum *)local_258);
        }
        pstd::optional<pbrt::BSDFSample>::~optional(&bs);
      }
      pbrt::SampledSpectrum::operator/=((SampledSpectrum *)&gtest_ar_,16384.0);
      FVar11 = pbrt::SampledSpectrum::MaxComponentValue((SampledSpectrum *)&gtest_ar_);
      local_248._0_4_ = FVar11;
      local_258._0_8_ = 0x3ff028f5c28f5c29;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&bs,"Lo.MaxComponentValue()","1.01",(float *)local_248,
                 (double *)local_258);
      if (bs.optionalValue.__data[0] == '\0') {
        testing::Message::Message((Message *)local_258);
        pMVar6 = testing::Message::operator<<((Message *)local_258,&description_local);
        pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [8])": Lo = ");
        pMVar6 = testing::Message::operator<<(pMVar6,(SampledSpectrum *)&gtest_ar_);
        pMVar6 = testing::Message::operator<<(pMVar6,(char (*) [8])", wo = ");
        pMVar6 = testing::Message::operator<<(pMVar6,(Vector3<float> *)&local_220);
        message = "";
        if (bs.optionalValue._8_8_ != 0) {
          message = *(char **)bs.optionalValue._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                   ,0x201,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_248,pMVar6);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_258);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&bs.optionalValue + 8));
    }
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tInv.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<const_pbrt::Transform,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void TestEnergyConservation(
    std::function<BSDF*(const SurfaceInteraction&, Allocator)> createBSDF,
    const char* description) {
    RNG rng;

    // Create BSDF, which requires creating a Shape, casting a Ray that
    // hits the shape to get a SurfaceInteraction object.
    auto t = std::make_shared<const Transform>(RotateX(-90));
    auto tInv = std::make_shared<const Transform>(Inverse(*t));

    bool reverseOrientation = false;
    std::shared_ptr<Disk> disk =
        std::make_shared<Disk>(t.get(), tInv.get(), reverseOrientation, 0., 1., 0, 360.);
    Point3f origin(0.1, 1,
                   0);  // offset slightly so we don't hit center of disk
    Vector3f direction(0, -1, 0);
    Ray r(origin, direction);
    auto si = disk->Intersect(r);
    ASSERT_TRUE(si.has_value());
    BSDF* bsdf = createBSDF(si->intr, Allocator());

    for (int i = 0; i < 10; ++i) {
        Point2f uo{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Vector3f woL = SampleUniformHemisphere(uo);
        Vector3f wo = bsdf->LocalToRender(woL);

        const int nSamples = 16384;
        SampledSpectrum Lo(0.f);
        for (int j = 0; j < nSamples; ++j) {
            Float u = rng.Uniform<Float>();
            Point2f ui{rng.Uniform<Float>(), rng.Uniform<Float>()};
            pstd::optional<BSDFSample> bs = bsdf->Sample_f(wo, u, ui);
            if (bs)
                Lo += bs->f * AbsDot(bs->wi, si->intr.n) / bs->pdf;
        }
        Lo /= nSamples;

        EXPECT_LT(Lo.MaxComponentValue(), 1.01)
            << description << ": Lo = " << Lo << ", wo = " << wo;
    }
}